

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpegd_rkv.c
# Opt level: O3

MPP_RET jpegd_write_rkv_htbl(JpegdHalCtx *ctx,JpegdSyntax *jpegd_syntax)

{
  RK_U32 *pRVar1;
  int iVar2;
  DcTable *pDVar3;
  DcTable *pDVar4;
  byte bVar5;
  uint uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  void *pvVar14;
  void *pvVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  short sVar19;
  int iVar20;
  uint uVar21;
  undefined2 uVar22;
  RK_U16 *pRVar23;
  long lVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  RK_U16 min_code_dc [16];
  RK_U16 min_code_ac [16];
  RK_U16 acc_addr_dc [16];
  RK_U16 acc_addr_ac [16];
  DcTable *local_128 [3];
  AcTable *local_110;
  DcTable *local_108;
  AcTable *local_100;
  RK_U8 htbl_value [192];
  byte bVar6;
  byte bVar7;
  byte bVar8;
  
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpegd_rkv","enter\n","jpegd_write_rkv_htbl");
  }
  pvVar14 = mpp_buffer_get_ptr_with_caller(ctx->pTableBase,"jpegd_write_rkv_htbl");
  pvVar15 = mpp_buffer_get_ptr_with_caller(ctx->pTableBase,"jpegd_write_rkv_htbl");
  min_code_ac[8] = 0;
  min_code_ac[9] = 0;
  min_code_ac[10] = 0;
  min_code_ac[0xb] = 0;
  min_code_ac[0xc] = 0;
  min_code_ac[0xd] = 0;
  min_code_ac[0xe] = 0;
  min_code_ac[0xf] = 0;
  min_code_ac[0] = 0;
  min_code_ac[1] = 0;
  min_code_ac[2] = 0;
  min_code_ac[3] = 0;
  min_code_ac[4] = 0;
  min_code_ac[5] = 0;
  min_code_ac[6] = 0;
  min_code_ac[7] = 0;
  min_code_dc[8] = 0;
  min_code_dc[9] = 0;
  min_code_dc[10] = 0;
  min_code_dc[0xb] = 0;
  min_code_dc[0xc] = 0;
  min_code_dc[0xd] = 0;
  min_code_dc[0xe] = 0;
  min_code_dc[0xf] = 0;
  min_code_dc[0] = 0;
  min_code_dc[1] = 0;
  min_code_dc[2] = 0;
  min_code_dc[3] = 0;
  min_code_dc[4] = 0;
  min_code_dc[5] = 0;
  min_code_dc[6] = 0;
  min_code_dc[7] = 0;
  acc_addr_ac[8] = 0;
  acc_addr_ac[9] = 0;
  acc_addr_ac[10] = 0;
  acc_addr_ac[0xb] = 0;
  acc_addr_ac[0xc] = 0;
  acc_addr_ac[0xd] = 0;
  acc_addr_ac[0xe] = 0;
  acc_addr_ac[0xf] = 0;
  acc_addr_ac[0] = 0;
  acc_addr_ac[1] = 0;
  acc_addr_ac[2] = 0;
  acc_addr_ac[3] = 0;
  acc_addr_ac[4] = 0;
  acc_addr_ac[5] = 0;
  acc_addr_ac[6] = 0;
  acc_addr_ac[7] = 0;
  acc_addr_dc[8] = 0;
  acc_addr_dc[9] = 0;
  acc_addr_dc[10] = 0;
  acc_addr_dc[0xb] = 0;
  acc_addr_dc[0xc] = 0;
  acc_addr_dc[0xd] = 0;
  acc_addr_dc[0xe] = 0;
  acc_addr_dc[0xf] = 0;
  acc_addr_dc[0] = 0;
  acc_addr_dc[1] = 0;
  acc_addr_dc[2] = 0;
  acc_addr_dc[3] = 0;
  acc_addr_dc[4] = 0;
  acc_addr_dc[5] = 0;
  acc_addr_dc[6] = 0;
  acc_addr_dc[7] = 0;
  memset(htbl_value,0,0xc0);
  local_128[0] = jpegd_syntax->dc_table + jpegd_syntax->dc_index[0];
  local_128[1] = (DcTable *)(jpegd_syntax->ac_table + jpegd_syntax->ac_index[0]);
  local_128[2] = jpegd_syntax->dc_table + jpegd_syntax->dc_index[1];
  local_110 = jpegd_syntax->ac_table + jpegd_syntax->ac_index[1];
  local_108 = jpegd_syntax->dc_table + jpegd_syntax->dc_index[1];
  local_100 = jpegd_syntax->ac_table + jpegd_syntax->ac_index[1];
  if (jpegd_syntax->nb_components != 0) {
    pRVar23 = (RK_U16 *)((long)pvVar15 + 0x180);
    lVar24 = (long)pvVar14 + 0x2c0;
    uVar16 = 0;
    do {
      uVar17 = (ulong)(uint)((int)uVar16 * 2);
      pDVar3 = local_128[uVar17];
      pDVar4 = local_128[uVar17 + 1];
      auVar10._14_2_ = 0;
      auVar10._0_2_ = min_code_dc[1];
      auVar10._2_2_ = min_code_dc[2];
      auVar10._4_2_ = min_code_dc[3];
      auVar10._6_2_ = min_code_dc[4];
      auVar10._8_2_ = min_code_dc[5];
      auVar10._10_2_ = min_code_dc[6];
      auVar10._12_2_ = min_code_dc[7];
      min_code_dc._0_16_ = auVar10 << 0x10;
      auVar11._14_2_ = 0;
      auVar11._0_2_ = acc_addr_dc[1];
      auVar11._2_2_ = acc_addr_dc[2];
      auVar11._4_2_ = acc_addr_dc[3];
      auVar11._6_2_ = acc_addr_dc[4];
      auVar11._8_2_ = acc_addr_dc[5];
      auVar11._10_2_ = acc_addr_dc[6];
      auVar11._12_2_ = acc_addr_dc[7];
      acc_addr_dc._0_16_ = auVar11 << 0x10;
      lVar18 = 0;
      iVar20 = 0;
      uVar21 = 0;
      do {
        iVar2 = *(int *)((long)pDVar3->bits + lVar18 * 2);
        uVar22 = (undefined2)uVar21;
        if (((lVar18 != 0) && (iVar2 == 0)) &&
           (uVar9 = (uint)*(ushort *)((long)min_code_dc + lVar18 + -2) * 2,
           (uVar21 & 0xffff) <= uVar9)) {
          uVar22 = (undefined2)uVar9;
        }
        *(undefined2 *)((long)min_code_dc + lVar18) = uVar22;
        iVar20 = iVar20 + iVar2;
        *(short *)((long)acc_addr_dc + lVar18) = (short)iVar20;
        uVar21 = (uVar21 + iVar2) * 2;
        lVar18 = lVar18 + 2;
      } while (lVar18 != 0x20);
      sVar19 = (short)pDVar3->bits[0xf] + -1;
      if (pDVar3->bits[0xf] == 0) {
        sVar19 = 0;
      }
      min_code_dc[0] = sVar19 + min_code_dc[0xf];
      lVar18 = 0;
      auVar12._14_2_ = 0;
      auVar12._0_2_ = min_code_ac[1];
      auVar12._2_2_ = min_code_ac[2];
      auVar12._4_2_ = min_code_ac[3];
      auVar12._6_2_ = min_code_ac[4];
      auVar12._8_2_ = min_code_ac[5];
      auVar12._10_2_ = min_code_ac[6];
      auVar12._12_2_ = min_code_ac[7];
      min_code_ac._0_16_ = auVar12 << 0x10;
      auVar13._14_2_ = 0;
      auVar13._0_2_ = acc_addr_ac[1];
      auVar13._2_2_ = acc_addr_ac[2];
      auVar13._4_2_ = acc_addr_ac[3];
      auVar13._6_2_ = acc_addr_ac[4];
      auVar13._8_2_ = acc_addr_ac[5];
      auVar13._10_2_ = acc_addr_ac[6];
      auVar13._12_2_ = acc_addr_ac[7];
      acc_addr_ac._0_16_ = auVar13 << 0x10;
      iVar20 = 0;
      uVar21 = 0;
      do {
        iVar2 = *(int *)((long)pDVar4->bits + lVar18 * 2);
        uVar22 = (undefined2)uVar21;
        if (((lVar18 != 0) && (iVar2 == 0)) &&
           (uVar9 = (uint)*(ushort *)((long)min_code_dc + lVar18 + 0x1e) * 2,
           (uVar21 & 0xffff) <= uVar9)) {
          uVar22 = (undefined2)uVar9;
        }
        *(undefined2 *)((long)min_code_ac + lVar18) = uVar22;
        iVar20 = iVar20 + iVar2;
        *(short *)((long)acc_addr_ac + lVar18) = (short)iVar20;
        uVar21 = (uVar21 + iVar2) * 2;
        lVar18 = lVar18 + 2;
      } while (lVar18 != 0x20);
      sVar19 = (short)pDVar4->bits[0xf] + -1;
      if (pDVar4->bits[0xf] == 0) {
        sVar19 = 0;
      }
      min_code_ac[0] = sVar19 + min_code_ac[0xf];
      lVar18 = 0;
      do {
        *(undefined2 *)((long)pRVar23 + lVar18) = *(undefined2 *)((long)min_code_dc + lVar18);
        lVar18 = lVar18 + 2;
      } while (lVar18 != 0x20);
      pRVar23 = pRVar23 + 0x10;
      lVar18 = 0;
      do {
        *pRVar23 = *(short *)((long)acc_addr_dc + lVar18 + 2) << 8 |
                   *(ushort *)((long)acc_addr_dc + lVar18);
        pRVar23 = pRVar23 + 1;
        lVar18 = lVar18 + 4;
      } while (lVar18 != 0x20);
      lVar18 = 0;
      do {
        *pRVar23 = min_code_ac[lVar18];
        pRVar23 = pRVar23 + 1;
        lVar18 = lVar18 + 1;
      } while (lVar18 != 0x10);
      lVar18 = 0;
      do {
        *pRVar23 = acc_addr_ac[lVar18 * 2 + 1] << 8 | acc_addr_ac[lVar18 * 2];
        pRVar23 = pRVar23 + 1;
        lVar18 = lVar18 + 1;
      } while (lVar18 != 8);
      lVar18 = 0;
      do {
        pRVar1 = pDVar3->vals + lVar18;
        uVar25 = (ushort)*pRVar1 & 0xff;
        uVar26 = (ushort)pRVar1[1] & 0xff;
        uVar27 = (ushort)pRVar1[2] & 0xff;
        uVar28 = (ushort)pRVar1[3] & 0xff;
        bVar5 = (uVar25 != 0) * (uVar25 < 0x100) * (char)(ushort)*pRVar1 - (0xff < uVar25);
        bVar6 = (uVar26 != 0) * (uVar26 < 0x100) * (char)(ushort)pRVar1[1] - (0xff < uVar26);
        bVar7 = (uVar27 != 0) * (uVar27 < 0x100) * (char)(ushort)pRVar1[2] - (0xff < uVar27);
        bVar8 = (uVar28 != 0) * (uVar28 < 0x100) * (char)(ushort)pRVar1[3] - (0xff < uVar28);
        *(uint *)(htbl_value + lVar18) =
             CONCAT13((bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8),
                      CONCAT12((bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7),
                               CONCAT11((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                                        (bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5))));
        lVar18 = lVar18 + 4;
      } while (lVar18 != 0xc);
      lVar18 = 0x10;
      do {
        htbl_value[lVar18] = (RK_U8)pDVar4->bits[lVar18];
        lVar18 = lVar18 + 1;
      } while (lVar18 != 0xb2);
      lVar18 = 0;
      do {
        *(RK_U8 *)(lVar24 + lVar18) = htbl_value[lVar18];
        lVar18 = lVar18 + 1;
      } while (lVar18 != 0xc0);
      uVar16 = uVar16 + 1;
      lVar24 = lVar24 + 0xc0;
    } while (uVar16 < jpegd_syntax->nb_components);
  }
  if ((jpegd_debug >> 8 & 1) != 0) {
    pvVar14 = mpp_buffer_get_ptr_with_caller(ctx->pTableBase,"jpegd_write_rkv_htbl");
    _mpp_log_l(4,"hal_jpegd_rkv","--------------huffman value tbl----------------------\n",
               (char *)0x0);
    uVar16 = 0xfffffffffffffff8;
    do {
      _mpp_log_l(4,"hal_jpegd_rkv","%02x%02x%02x%02x%02x%02x%02x%02x\n",(char *)0x0,
                 (ulong)*(byte *)((long)pvVar14 + uVar16 + 0x2cf),
                 (ulong)*(byte *)((long)pvVar14 + uVar16 + 0x2ce),
                 (ulong)*(byte *)((long)pvVar14 + uVar16 + 0x2cd),
                 (ulong)*(byte *)((long)pvVar14 + uVar16 + 0x2cc),
                 (ulong)*(byte *)((long)pvVar14 + uVar16 + 0x2cb),
                 (ulong)*(byte *)((long)pvVar14 + uVar16 + 0x2ca),
                 (ulong)*(byte *)((long)pvVar14 + uVar16 + 0x2c9),
                 (ulong)*(byte *)((long)pvVar14 + uVar16 + 0x2c8));
      uVar16 = uVar16 + 8;
    } while (uVar16 < 0x238);
    pvVar14 = mpp_buffer_get_ptr_with_caller(ctx->pTableBase,"jpegd_write_rkv_htbl");
    _mpp_log_l(4,"hal_jpegd_rkv","--------------huffman mincode tbl----------------------\n",
               (char *)0x0);
    uVar16 = 0xfffffffffffffff8;
    do {
      _mpp_log_l(4,"hal_jpegd_rkv","%02x%02x%02x%02x%02x%02x%02x%02x\n",(char *)0x0,
                 (ulong)*(byte *)((long)pvVar14 + uVar16 + 399),
                 (ulong)*(byte *)((long)pvVar14 + uVar16 + 0x18e),
                 (ulong)*(byte *)((long)pvVar14 + uVar16 + 0x18d),
                 (ulong)*(byte *)((long)pvVar14 + uVar16 + 0x18c),
                 (ulong)*(byte *)((long)pvVar14 + uVar16 + 0x18b),
                 (ulong)*(byte *)((long)pvVar14 + uVar16 + 0x18a),
                 (ulong)*(byte *)((long)pvVar14 + uVar16 + 0x189),
                 (ulong)*(byte *)((long)pvVar14 + uVar16 + 0x188));
      uVar16 = uVar16 + 8;
    } while (uVar16 < 0x118);
  }
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpegd_rkv","exit\n","jpegd_write_rkv_htbl");
  }
  return MPP_OK;
}

Assistant:

MPP_RET jpegd_write_rkv_htbl(JpegdHalCtx *ctx, JpegdSyntax *jpegd_syntax)
{
    jpegd_dbg_func("enter\n");
    MPP_RET ret = MPP_OK;

    JpegdSyntax *s = jpegd_syntax;
    void * htbl_ptr[6] = {NULL};
    RK_U32 i, j, k = 0;
    RK_U8 *p_htbl_value = (RK_U8 *)mpp_buffer_get_ptr(ctx->pTableBase) + RKD_HUFFMAN_VALUE_TBL_OFFSET;
    RK_U16 *p_htbl_mincode = (RK_U16 *)mpp_buffer_get_ptr(ctx->pTableBase) + RKD_HUFFMAN_MINCODE_TBL_OFFSET  / 2;
    RK_U16 min_code_ac[16] = {0};
    RK_U16 min_code_dc[16] = {0};
    RK_U16 acc_addr_ac[16] = {0};
    RK_U16 acc_addr_dc[16] = {0};
    RK_U8 htbl_value[192] = {0};
    RK_U16 code = 0;
    RK_S32 addr = 0;
    RK_U32 len = 0;
    AcTable *ac_ptr;
    DcTable *dc_ptr;

    htbl_ptr[0] = &s->dc_table[s->dc_index[0]];
    htbl_ptr[1] = &s->ac_table[s->ac_index[0]];

    htbl_ptr[2] = &s->dc_table[s->dc_index[1]];
    htbl_ptr[3] = &s->ac_table[s->ac_index[1]];

    htbl_ptr[4] = htbl_ptr[2];
    htbl_ptr[5] = htbl_ptr[3];

    for (k = 0; k < s->nb_components; k++) {
        dc_ptr = (DcTable *)htbl_ptr[k * 2];
        ac_ptr = (AcTable *)htbl_ptr[k * 2 + 1];

        len = dc_ptr->bits[0];
        code = addr = 0;
        min_code_dc[0] = 0;
        acc_addr_dc[0] = 0;

        for (j = 0; j < 16; j++) {
            len = dc_ptr->bits[j];

            if (len == 0 && j > 0) {
                if (code > (min_code_dc[j - 1] << 1))
                    min_code_dc[j] = code;
                else
                    min_code_dc[j] = min_code_dc[j - 1] << 1;
            } else {
                min_code_dc[j] = code;
            }

            code += len;
            addr += len;
            acc_addr_dc[j] = addr;
            code <<= 1;

        }

        if (dc_ptr->bits[15])
            min_code_dc[0] = min_code_dc[15] + dc_ptr->bits[15] - 1;
        else
            min_code_dc[0] = min_code_dc[15];

        len = ac_ptr->bits[0];
        code = addr = 0;
        min_code_ac[0] = 0;
        acc_addr_ac[0] = 0;
        for (j = 0; j < 16; j++) {
            len = ac_ptr->bits[j];

            if (len == 0 && j > 0) {
                if (code > (min_code_ac[j - 1] << 1))
                    min_code_ac[j] = code;
                else
                    min_code_ac[j] = min_code_ac[j - 1] << 1;
            } else {
                min_code_ac[j] = code;
            }

            code += len;
            addr += len;
            acc_addr_ac[j] = addr;
            code <<= 1;
        }

        if (ac_ptr->bits[15])
            min_code_ac[0] = min_code_ac[15] + ac_ptr->bits[15] - 1;
        else
            min_code_ac[0] = min_code_ac[15];

        for (i = 0; i < 16; i++) {
            *p_htbl_mincode++ = min_code_dc[i];
        }

        for (i = 0; i < 8; i++) {
            *p_htbl_mincode++ = acc_addr_dc[2 * i] | acc_addr_dc[2 * i + 1] << 8;
        }

        for (i = 0; i < 16; i++) {
            *p_htbl_mincode++ = min_code_ac[i];
        }

        for (i = 0; i < 8; i++) {
            *p_htbl_mincode++ = acc_addr_ac[2 * i] | acc_addr_ac[2 * i + 1] << 8;
        }

        for (i = 0; i < MAX_DC_HUFFMAN_TABLE_LENGTH; i++) {
            htbl_value[i] = dc_ptr->vals[i];
        }

        for (i = 0; i < MAX_AC_HUFFMAN_TABLE_LENGTH; i++) {
            htbl_value[i + 16] = ac_ptr->vals[i];
        }

        for (i = 0; i < 12 * 16; i++) {
            *p_htbl_value++ = htbl_value[i];
        }
    }

    if (jpegd_debug & JPEGD_DBG_HAL_TBL) {
        RK_U8 *data = (RK_U8 *)mpp_buffer_get_ptr(ctx->pTableBase) + RKD_HUFFMAN_VALUE_TBL_OFFSET;

        mpp_log("--------------huffman value tbl----------------------\n");
        for (i = 0; i < RKD_HUFFMAN_VALUE_TBL_SIZE; i += 8) {
            mpp_log("%02x%02x%02x%02x%02x%02x%02x%02x\n",
                    data[i + 7], data[i + 6], data[i + 5], data[i + 4],
                    data[i + 3], data[i + 2], data[i + 1], data[i + 0]);
        }

        data = NULL;
        data = (RK_U8 *)mpp_buffer_get_ptr(ctx->pTableBase) + RKD_HUFFMAN_MINCODE_TBL_OFFSET;

        mpp_log("--------------huffman mincode tbl----------------------\n");
        for (i = 0; i < RKD_HUFFMAN_MINCODE_TBL_SIZE; i += 8) {
            mpp_log("%02x%02x%02x%02x%02x%02x%02x%02x\n",
                    data[i + 7], data[i + 6], data[i + 5], data[i + 4],
                    data[i + 3], data[i + 2], data[i + 1], data[i + 0]);
        }
    }

    jpegd_dbg_func("exit\n");
    return ret;
}